

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_level_sizes(exr_const_context_t_conflict ctxt,int part_index,int levelx,int levely,
                   int32_t *levw,int32_t *levh)

{
  undefined4 uVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  undefined4 *in_R8;
  exr_const_context_t_conflict in_R9;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_R9);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_R9);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if ((*(int *)(lVar2 + 4) == 1) || (*(int *)(lVar2 + 4) == 3)) {
        if (((*(long *)(lVar2 + 0x60) == 0) ||
            (((*(int *)(lVar2 + 0xc0) < 1 || (*(int *)(lVar2 + 0xc4) < 1)) ||
             (*(long *)(lVar2 + 200) == 0)))) || (*(long *)(lVar2 + 0xd0) == 0)) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(in_R9);
          }
          local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"Tile data missing or corrupt");
        }
        else if (((in_EDX < 0) || (in_ECX < 0)) ||
                ((*(int *)(lVar2 + 0xc0) <= in_EDX || (*(int *)(lVar2 + 0xc4) <= in_ECX)))) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(in_R9);
          }
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,4);
        }
        else {
          if (in_R8 != (undefined4 *)0x0) {
            *in_R8 = *(undefined4 *)(*(long *)(lVar2 + 0xd8) + (long)in_EDX * 4);
          }
          if (in_R9 != (exr_const_context_t_conflict)0x0) {
            uVar1 = *(undefined4 *)(*(long *)(lVar2 + 0xe0) + (long)in_ECX * 4);
            in_R9->mode = (char)uVar1;
            in_R9->version = (char)((uint)uVar1 >> 8);
            in_R9->max_name_length = (char)((uint)uVar1 >> 0x10);
            in_R9->is_singlepart_tiled = (char)((uint)uVar1 >> 0x18);
          }
          if (*in_RDI == '\x01') {
            internal_exr_unlock(in_R9);
          }
          local_4 = 0;
        }
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_R9);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x13);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_level_sizes (
    exr_const_context_t ctxt,
    int                 part_index,
    int                 levelx,
    int                 levely,
    int32_t*            levw,
    int32_t*            levh)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelx < 0 || levely < 0 || levelx >= part->num_tile_levels_x ||
            levely >= part->num_tile_levels_y)
            return EXR_UNLOCK_WRITE_AND_RETURN (
                ctxt->standard_error (ctxt, EXR_ERR_ARGUMENT_OUT_OF_RANGE));

        if (levw) *levw = part->tile_level_tile_size_x[levelx];
        if (levh) *levh = part->tile_level_tile_size_y[levely];
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}